

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O3

void normalize_suite::normalize_increasing(void)

{
  int *second_begin;
  basic_iterator<int> first_end;
  basic_iterator<int> first_end_00;
  basic_iterator<int> first_end_01;
  basic_iterator<int> first_end_02;
  basic_iterator<int> first_end_03;
  basic_iterator<int> first_end_04;
  basic_iterator<int> first_end_05;
  basic_iterator<int> first_end_06;
  basic_iterator<int> first_end_07;
  basic_iterator<int> first_end_08;
  basic_iterator<int> first_end_09;
  basic_iterator<int> first_end_10;
  basic_iterator<int> first_end_11;
  basic_iterator<int> first_end_12;
  basic_iterator<int> first_end_13;
  basic_iterator<int> first_end_14;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_02;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_03;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_04;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_05;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> second_end_06;
  reference piVar1;
  ulong uVar2;
  ulong uVar3;
  initializer_list<int> input;
  initializer_list<int> __l;
  initializer_list<int> input_00;
  initializer_list<int> __l_00;
  initializer_list<int> input_01;
  initializer_list<int> __l_01;
  initializer_list<int> input_02;
  initializer_list<int> __l_02;
  initializer_list<int> input_03;
  initializer_list<int> __l_03;
  initializer_list<int> input_04;
  initializer_list<int> __l_04;
  initializer_list<int> input_05;
  initializer_list<int> __l_05;
  initializer_list<int> input_06;
  initializer_list<int> __l_06;
  basic_iterator<int> first_begin;
  basic_iterator<int> first_begin_00;
  basic_iterator<int> first_begin_01;
  basic_iterator<int> first_begin_02;
  basic_iterator<int> first_begin_03;
  basic_iterator<int> first_begin_04;
  basic_iterator<int> first_begin_05;
  basic_iterator<int> first_begin_06;
  basic_iterator<int> first_begin_07;
  basic_iterator<int> first_begin_08;
  basic_iterator<int> first_begin_09;
  basic_iterator<int> first_begin_10;
  basic_iterator<int> first_begin_11;
  basic_iterator<int> first_begin_12;
  basic_iterator<int> first_begin_13;
  basic_iterator<int> first_begin_14;
  circular_view<int,_18446744073709551615UL> span;
  vector<int,_std::allocator<int>_> expect;
  array<int,_4UL> array;
  allocator_type local_179;
  circular_view<int,_18446744073709551615UL> local_178;
  vector<int,_std::allocator<int>_> local_158;
  undefined4 uStack_140;
  undefined4 uStack_13c;
  int local_138 [8];
  circular_view<int,_18446744073709551615UL> *local_118;
  size_type sStack_110;
  circular_view<int,_18446744073709551615UL> *local_108;
  size_type sStack_100;
  circular_view<int,_18446744073709551615UL> *local_f8;
  size_type sStack_f0;
  circular_view<int,_18446744073709551615UL> *local_e8;
  size_type sStack_e0;
  circular_view<int,_18446744073709551615UL> *local_d8;
  size_type sStack_d0;
  circular_view<int,_18446744073709551615UL> *local_c8;
  size_type sStack_c0;
  circular_view<int,_18446744073709551615UL> *local_b8;
  size_type sStack_b0;
  circular_view<int,_18446744073709551615UL> *local_a8;
  size_type sStack_a0;
  circular_view<int,_18446744073709551615UL> *local_98;
  size_type sStack_90;
  circular_view<int,_18446744073709551615UL> *local_88;
  size_type sStack_80;
  circular_view<int,_18446744073709551615UL> *local_78;
  size_type sStack_70;
  circular_view<int,_18446744073709551615UL> *local_68;
  size_type sStack_60;
  circular_view<int,_18446744073709551615UL> *local_58;
  size_type sStack_50;
  circular_view<int,_18446744073709551615UL> *local_48;
  size_type sStack_40;
  circular_view<int,_18446744073709551615UL> *local_38;
  size_type sStack_30;
  circular_view<int,_18446744073709551615UL> *local_28;
  size_type sStack_20;
  
  second_begin = local_138 + 4;
  local_138[4] = 0;
  local_138[5] = 0;
  local_138[6] = 0;
  local_138[7] = 0;
  local_178.member.cap = 4;
  local_178.member.size = 0;
  local_178.member.next = 4;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,0xb);
  input._M_len = 1;
  input._M_array = (iterator)&local_158;
  local_178.member.data = second_begin;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd95,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd97,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0xb;
  __l._M_len = 1;
  __l._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_20 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_20 = local_178.member.next % uVar2;
  }
  second_end._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end.current = sStack_20;
  first_end.parent = &local_178;
  first_begin.current = uVar3;
  first_begin.parent = &local_178;
  local_28 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9b,"void normalize_suite::normalize_increasing()",first_begin,first_end,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_30 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_30 = local_178.member.next % uVar2;
  }
  first_end_00.current = sStack_30;
  first_end_00.parent = &local_178;
  first_begin_00.current = uVar3;
  first_begin_00.parent = &local_178;
  local_38 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xd9d,"void normalize_suite::normalize_increasing()",first_begin_00,first_end_00,
             second_begin,local_138 + local_178.member.size + 4);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  input_00._M_len = 2;
  input_00._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_00);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda2,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda4,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0xb;
  local_138[1] = 0x16;
  __l_00._M_len = 2;
  __l_00._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_00,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_40 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_40 = local_178.member.next % uVar2;
  }
  second_end_00._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_00._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_01.current = sStack_40;
  first_end_01.parent = &local_178;
  first_begin_01.current = uVar3;
  first_begin_01.parent = &local_178;
  local_48 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xda8,"void normalize_suite::normalize_increasing()",first_begin_01,first_end_01,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_00);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_50 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_50 = local_178.member.next % uVar2;
  }
  first_end_02.current = sStack_50;
  first_end_02.parent = &local_178;
  first_begin_02.current = uVar3;
  first_begin_02.parent = &local_178;
  local_58 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaa,"void normalize_suite::normalize_increasing()",first_begin_02,first_end_02,
             second_begin,local_138 + local_178.member.size + 4);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  input_01._M_len = 3;
  input_01._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_01);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdaf,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb1,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0xb;
  local_138[1] = 0x16;
  local_138[2] = 0x21;
  __l_01._M_len = 3;
  __l_01._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_01,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_60 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_60 = local_178.member.next % uVar2;
  }
  second_end_01._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_01._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_03.current = sStack_60;
  first_end_03.parent = &local_178;
  first_begin_03.current = uVar3;
  first_begin_03.parent = &local_178;
  local_68 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb5,"void normalize_suite::normalize_increasing()",first_begin_03,first_end_03,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_01);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_70 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_70 = local_178.member.next % uVar2;
  }
  first_end_04.current = sStack_70;
  first_end_04.parent = &local_178;
  first_begin_04.current = uVar3;
  first_begin_04.parent = &local_178;
  local_78 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdb7,"void normalize_suite::normalize_increasing()",first_begin_04,first_end_04,
             second_begin,local_138 + local_178.member.size + 4);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_02._M_len = 4;
  input_02._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_02);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbc,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdbe,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0xb;
  local_138[1] = 0x16;
  local_138[2] = 0x21;
  local_138[3] = 0x2c;
  __l_02._M_len = 4;
  __l_02._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_02,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_80 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_80 = local_178.member.next % uVar2;
  }
  second_end_02._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_02._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_05.current = sStack_80;
  first_end_05.parent = &local_178;
  first_begin_05.current = uVar3;
  first_begin_05.parent = &local_178;
  local_88 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc2,"void normalize_suite::normalize_increasing()",first_begin_05,first_end_05,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_02);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_90 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_90 = local_178.member.next % uVar2;
  }
  first_end_06.current = sStack_90;
  first_end_06.parent = &local_178;
  first_begin_06.current = uVar3;
  first_begin_06.parent = &local_178;
  local_98 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc4,"void normalize_suite::normalize_increasing()",first_begin_06,first_end_06,
             second_begin,(int *)&local_118);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  input_03._M_len = 5;
  input_03._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_03);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdc9,"void normalize_suite::normalize_increasing()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcb,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0x16;
  local_138[1] = 0x21;
  local_138[2] = 0x2c;
  local_138[3] = 0x37;
  __l_03._M_len = 4;
  __l_03._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_03,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_a0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_a0 = local_178.member.next % uVar2;
  }
  second_end_03._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_03._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_07.current = sStack_a0;
  first_end_07.parent = &local_178;
  first_begin_07.current = uVar3;
  first_begin_07.parent = &local_178;
  local_a8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdcf,"void normalize_suite::normalize_increasing()",first_begin_07,first_end_07,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_03);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_b0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_b0 = local_178.member.next % uVar2;
  }
  first_end_08.current = sStack_b0;
  first_end_08.parent = &local_178;
  first_begin_08.current = uVar3;
  first_begin_08.parent = &local_178;
  local_b8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd1,"void normalize_suite::normalize_increasing()",first_begin_08,first_end_08,
             second_begin,(int *)&local_118);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  input_04._M_len = 6;
  input_04._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_04);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd6,"void normalize_suite::normalize_increasing()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdd8,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0x21;
  local_138[1] = 0x2c;
  local_138[2] = 0x37;
  local_138[3] = 0x42;
  __l_04._M_len = 4;
  __l_04._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_04,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_c0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_c0 = local_178.member.next % uVar2;
  }
  second_end_04._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_04._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_09.current = sStack_c0;
  first_end_09.parent = &local_178;
  first_begin_09.current = uVar3;
  first_begin_09.parent = &local_178;
  local_c8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xddc,"void normalize_suite::normalize_increasing()",first_begin_09,first_end_09,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_04);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_d0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_d0 = local_178.member.next % uVar2;
  }
  first_end_10.current = sStack_d0;
  first_end_10.parent = &local_178;
  first_begin_10.current = uVar3;
  first_begin_10.parent = &local_178;
  local_d8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdde,"void normalize_suite::normalize_increasing()",first_begin_10,first_end_10,
             second_begin,(int *)&local_118);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_140 = 0x4d;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_05._M_len = 7;
  input_05._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_05);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) != std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde3,"void normalize_suite::normalize_increasing()",piVar1 != second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde5,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0x2c;
  local_138[1] = 0x37;
  local_138[2] = 0x42;
  local_138[3] = 0x4d;
  __l_05._M_len = 4;
  __l_05._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_05,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_e0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_e0 = local_178.member.next % uVar2;
  }
  second_end_05._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_05._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_11.current = sStack_e0;
  first_end_11.parent = &local_178;
  first_begin_11.current = uVar3;
  first_begin_11.parent = &local_178;
  local_e8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xde9,"void normalize_suite::normalize_increasing()",first_begin_11,first_end_11,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_05);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_f0 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_f0 = local_178.member.next % uVar2;
  }
  first_end_12.current = sStack_f0;
  first_end_12.parent = &local_178;
  first_begin_12.current = uVar3;
  first_begin_12.parent = &local_178;
  local_f8 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdeb,"void normalize_suite::normalize_increasing()",first_begin_12,first_end_12,
             second_begin,(int *)&local_118);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_4_ = 0x37;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0x42;
  uStack_140 = 0x4d;
  uStack_13c = 0x58;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x160000000b;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = 0x21;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = 0x2c;
  input_06._M_len = 8;
  input_06._M_array = (iterator)&local_158;
  vista::circular_view<int,_18446744073709551615UL>::assign(&local_178,input_06);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf0,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  vista::circular_view<int,_18446744073709551615UL>::rotate_front(&local_178);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar2 = uVar2 - 1 & local_178.member.next - local_178.member.size;
  }
  else {
    uVar2 = (local_178.member.next - local_178.member.size) % uVar2;
  }
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _0_4_ = (undefined4)uVar2;
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish.
  _4_4_ = (undefined4)(uVar2 >> 0x20);
  local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_178;
  piVar1 = vista::circular_view<int,_18446744073709551615UL>::basic_iterator<int>::operator*
                     ((basic_iterator<int> *)&local_158);
  boost::detail::test_impl
            ("std::addressof(*span.begin()) == std::addressof(*array.begin())",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf2,"void normalize_suite::normalize_increasing()",piVar1 == second_begin);
  local_138[0] = 0x37;
  local_138[1] = 0x42;
  local_138[2] = 0x4d;
  local_138[3] = 0x58;
  __l_06._M_len = 4;
  __l_06._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_158,__l_06,&local_179);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_100 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_100 = local_178.member.next % uVar2;
  }
  second_end_06._M_current._4_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._4_4_;
  second_end_06._M_current._0_4_ =
       local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish._0_4_;
  first_end_13.current = sStack_100;
  first_end_13.parent = &local_178;
  first_begin_13.current = uVar3;
  first_begin_13.parent = &local_178;
  local_108 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf6,"void normalize_suite::normalize_increasing()",first_begin_13,first_end_13,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start,second_end_06);
  uVar2 = local_178.member.cap * 2;
  if ((uVar2 & local_178.member.cap * 2 - 1) == 0) {
    uVar3 = local_178.member.next - local_178.member.size & uVar2 - 1;
    sStack_110 = uVar2 - 1 & local_178.member.next;
  }
  else {
    uVar3 = (local_178.member.next - local_178.member.size) % uVar2;
    sStack_110 = local_178.member.next % uVar2;
  }
  first_end_14.current = sStack_110;
  first_end_14.parent = &local_178;
  first_begin_14.current = uVar3;
  first_begin_14.parent = &local_178;
  local_118 = &local_178;
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,int*>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_suite.cpp"
             ,0xdf8,"void normalize_suite::normalize_increasing()",first_begin_14,first_end_14,
             second_begin,(int *)&local_118);
  if ((view_pointer)
      local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (view_pointer)0x0) {
    operator_delete(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT44(local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._4_4_,
                             local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_4_) -
                    (long)local_158.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void normalize_increasing()
{
    std::array<int, 4> array = {};
    circular_view<int> span(array.begin(), array.end());
    {
        // 11 X X X => 11 X X X
        span = { 11 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 X X => 11 22 X X
        span = { 11, 22 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 X => 11 22 33 X
        span = { 11, 22, 33 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.begin() + span.size());
    }
    {
        // 11 22 33 44 => 11 22 33 44
        span = { 11, 22, 33, 44 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 11, 22, 33, 44 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 22 33 44 => 22 33 44 55
        span = { 11, 22, 33, 44, 55 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 22, 33, 44, 55 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 33 44 => 33 44 55 66
        span = { 11, 22, 33, 44, 55, 66 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 33, 44, 55, 66 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 44 => 44 55 66 77
        span = { 11, 22, 33, 44, 55, 66, 77 };
        BOOST_TEST(std::addressof(*span.begin()) != std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 44, 55, 66, 77 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
    {
        // 55 66 77 88 => 55 66 77 88
        span = { 11, 22, 33, 44, 55, 66, 77, 88 };
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));
        span.rotate_front();
        BOOST_TEST(std::addressof(*span.begin()) == std::addressof(*array.begin()));

        std::vector<int> expect = { 55, 66, 77, 88 };
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          expect.begin(), expect.end());
        BOOST_TEST_ALL_EQ(span.begin(), span.end(),
                          array.begin(), array.end());
    }
}